

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngset.c
# Opt level: O3

void png_set_iCCP(png_const_structrp png_ptr,png_inforp info_ptr,png_const_charp name,
                 int compression_type,png_const_bytep profile,png_uint_32 proflen)

{
  png_uint_16 *ppVar1;
  byte *pbVar2;
  undefined4 in_EAX;
  int iVar3;
  size_t sVar4;
  png_charp __dest;
  png_bytep __dest_00;
  char *error_message;
  undefined1 auVar5 [16];
  
  auVar5._0_4_ = -(uint)(png_ptr == (png_const_structrp)0x0);
  auVar5._4_4_ = -(uint)(info_ptr == (png_inforp)0x0);
  auVar5._8_4_ = -(uint)(name == (png_const_charp)0x0);
  auVar5._12_4_ = -(uint)(profile == (png_const_bytep)0x0);
  iVar3 = movmskps(in_EAX,auVar5);
  if (iVar3 == 0) {
    if (compression_type != 0) {
      png_app_error(png_ptr,"Invalid iCCP compression method");
    }
    iVar3 = png_colorspace_set_ICC
                      (png_ptr,&info_ptr->colorspace,name,proflen,profile,(uint)info_ptr->color_type
                      );
    png_colorspace_sync_info(png_ptr,info_ptr);
    if (iVar3 != 0) {
      ppVar1 = &(info_ptr->colorspace).flags;
      *(byte *)ppVar1 = (byte)*ppVar1 | 0x18;
      sVar4 = strlen(name);
      __dest = (png_charp)png_malloc_warn(png_ptr,sVar4 + 1);
      if (__dest == (png_charp)0x0) {
        error_message = "Insufficient memory to process iCCP chunk";
      }
      else {
        memcpy(__dest,name,sVar4 + 1);
        __dest_00 = (png_bytep)png_malloc_warn(png_ptr,(ulong)proflen);
        if (__dest_00 != (png_bytep)0x0) {
          memcpy(__dest_00,profile,(ulong)proflen);
          png_free_data(png_ptr,info_ptr,0x10,0);
          info_ptr->iccp_proflen = proflen;
          info_ptr->iccp_name = __dest;
          info_ptr->iccp_profile = __dest_00;
          *(byte *)&info_ptr->free_me = (byte)info_ptr->free_me | 0x10;
          pbVar2 = (byte *)((long)&info_ptr->valid + 1);
          *pbVar2 = *pbVar2 | 0x10;
          return;
        }
        png_free(png_ptr,__dest);
        error_message = "Insufficient memory to process iCCP profile";
      }
      png_benign_error(png_ptr,error_message);
      return;
    }
  }
  return;
}

Assistant:

void PNGAPI
png_set_iCCP(png_const_structrp png_ptr, png_inforp info_ptr,
    png_const_charp name, int compression_type,
    png_const_bytep profile, png_uint_32 proflen)
{
   png_charp new_iccp_name;
   png_bytep new_iccp_profile;
   size_t length;

   png_debug1(1, "in %s storage function", "iCCP");

   if (png_ptr == NULL || info_ptr == NULL || name == NULL || profile == NULL)
      return;

   if (compression_type != PNG_COMPRESSION_TYPE_BASE)
      png_app_error(png_ptr, "Invalid iCCP compression method");

   /* Set the colorspace first because this validates the profile; do not
    * override previously set app cHRM or gAMA here (because likely as not the
    * application knows better than libpng what the correct values are.)  Pass
    * the info_ptr color_type field to png_colorspace_set_ICC because in the
    * write case it has not yet been stored in png_ptr.
    */
   {
      int result = png_colorspace_set_ICC(png_ptr, &info_ptr->colorspace, name,
          proflen, profile, info_ptr->color_type);

      png_colorspace_sync_info(png_ptr, info_ptr);

      /* Don't do any of the copying if the profile was bad, or inconsistent. */
      if (result == 0)
         return;

      /* But do write the gAMA and cHRM chunks from the profile. */
      info_ptr->colorspace.flags |=
         PNG_COLORSPACE_FROM_gAMA|PNG_COLORSPACE_FROM_cHRM;
   }

   length = strlen(name)+1;
   new_iccp_name = png_voidcast(png_charp, png_malloc_warn(png_ptr, length));

   if (new_iccp_name == NULL)
   {
      png_benign_error(png_ptr, "Insufficient memory to process iCCP chunk");

      return;
   }

   memcpy(new_iccp_name, name, length);
   new_iccp_profile = png_voidcast(png_bytep,
       png_malloc_warn(png_ptr, proflen));

   if (new_iccp_profile == NULL)
   {
      png_free(png_ptr, new_iccp_name);
      png_benign_error(png_ptr,
          "Insufficient memory to process iCCP profile");

      return;
   }

   memcpy(new_iccp_profile, profile, proflen);

   png_free_data(png_ptr, info_ptr, PNG_FREE_ICCP, 0);

   info_ptr->iccp_proflen = proflen;
   info_ptr->iccp_name = new_iccp_name;
   info_ptr->iccp_profile = new_iccp_profile;
   info_ptr->free_me |= PNG_FREE_ICCP;
   info_ptr->valid |= PNG_INFO_iCCP;
}